

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

int xe::getEnumValue(char *enumName,EnumMapEntry *entries,int numEntries,char *name)

{
  deBool dVar1;
  TestResultParseError *this;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  deUint32 local_2c;
  int ndx;
  deUint32 hash;
  char *name_local;
  EnumMapEntry *pEStack_18;
  int numEntries_local;
  EnumMapEntry *entries_local;
  char *enumName_local;
  
  _ndx = name;
  name_local._4_4_ = numEntries;
  pEStack_18 = entries;
  entries_local = (EnumMapEntry *)enumName;
  local_2c = deStringHash(name);
  local_30 = 0;
  do {
    if (name_local._4_4_ <= local_30) {
      this = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Could not map \'",&local_b1);
      std::operator+(&local_90,&local_b0,_ndx);
      std::operator+(&local_70,&local_90,"\' to ");
      std::operator+(&local_50,&local_70,(char *)entries_local);
      TestResultParseError::TestResultParseError(this,&local_50);
      __cxa_throw(this,&TestResultParseError::typeinfo,TestResultParseError::~TestResultParseError);
    }
    if (pEStack_18[local_30].hash == local_2c) {
      dVar1 = deStringEqual(pEStack_18[local_30].name,_ndx);
      if (dVar1 != 0) {
        return pEStack_18[local_30].value;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static inline int getEnumValue (const char* enumName, const EnumMapEntry* entries, int numEntries, const char* name)
{
	deUint32 hash = deStringHash(name);

	for (int ndx = 0; ndx < numEntries; ndx++)
	{
		if (entries[ndx].hash == hash && deStringEqual(entries[ndx].name, name))
			return entries[ndx].value;
	}

	throw TestResultParseError(string("Could not map '") + name + "' to " + enumName);
}